

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetLineControl::finishChange
          (QWidgetLineControl *this,int validateFromState,bool update,bool edited)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QValidator *pQVar4;
  qsizetype qVar5;
  iterator __last;
  byte in_CL;
  byte edited_00;
  byte in_DL;
  int in_ESI;
  QWidgetLineControl *in_RDI;
  long in_FS_OFFSET;
  byte bVar6;
  bool wasValidInput;
  QString actualText;
  int cursorCopy;
  QString textCopy;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QWidgetLineControl *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff80;
  QWidgetLineControl *txt;
  undefined1 forceUpdate;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  const_iterator in_stack_ffffffffffffffb8;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  edited_00 = in_DL & 1;
  bVar1 = in_CL & 1;
  if ((*(ushort *)&in_RDI->field_0x50 >> 6 & 1) != 0) {
    bVar6 = (*(ushort *)&in_RDI->field_0x50 >> 8 & 1) != 0;
    *(ushort *)&in_RDI->field_0x50 = *(ushort *)&in_RDI->field_0x50 & 0xfeff | 0x100;
    txt = in_RDI;
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QValidator> *)0x5db644);
    if (bVar2) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)in_stack_ffffffffffffff60,
                       (QString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      local_24 = in_RDI->m_cursor;
      pQVar4 = QPointer<QValidator>::operator->((QPointer<QValidator> *)0x5db6ab);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,&local_20,&local_24);
      *(ushort *)&in_RDI->field_0x50 =
           *(ushort *)&in_RDI->field_0x50 & 0xfeff | (ushort)(iVar3 != 0) << 8;
      if ((*(ushort *)&in_RDI->field_0x50 >> 8 & 1) == 0) {
        inputRejected((QWidgetLineControl *)0x5db76e);
LAB_005db76e:
        iVar3 = 0;
      }
      else {
        bVar2 = ::operator!=((QString *)in_stack_ffffffffffffff60,
                             (QString *)
                             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        if (!bVar2) {
          in_RDI->m_cursor = local_24;
          goto LAB_005db76e;
        }
        internalSetText((QWidgetLineControl *)
                        CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),(QString *)txt
                        ,in_ESI,(bool)edited_00);
        in_stack_ffffffffffffff97 = 1;
        iVar3 = 1;
      }
      QString::~QString((QString *)0x5db783);
      if (iVar3 != 0) goto LAB_005db9bd;
      in_stack_ffffffffffffff7c = 0;
    }
    forceUpdate = (undefined1)((ulong)txt >> 0x38);
    if (((-1 < in_ESI) && ((bVar6 & 1) != 0)) && ((*(ushort *)&in_RDI->field_0x50 >> 8 & 1) == 0)) {
      qVar5 = QList<int>::size(&in_RDI->m_transactions);
      if (qVar5 != 0) {
        in_stack_ffffffffffffff97 = 0;
        goto LAB_005db9bd;
      }
      internalUndo((QWidgetLineControl *)
                   CONCAT44(in_ESI,CONCAT13(edited_00,
                                            CONCAT12(bVar1,CONCAT11(bVar6,in_stack_ffffffffffffff80)
                                                    ))),in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff60 = (QWidgetLineControl *)&in_RDI->m_history;
      std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>::begin
                ((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                  *)in_stack_ffffffffffffff60);
      __gnu_cxx::
      __normal_iterator<QWidgetLineControl::Command_*,_std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>_>
      ::operator+((__normal_iterator<QWidgetLineControl::Command_*,_std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>_>
                   *)in_RDI,(difference_type)in_stack_ffffffffffffff60);
      __gnu_cxx::
      __normal_iterator<QWidgetLineControl::Command_const*,std::vector<QWidgetLineControl::Command,std::allocator<QWidgetLineControl::Command>>>
      ::__normal_iterator<QWidgetLineControl::Command*>
                ((__normal_iterator<const_QWidgetLineControl::Command_*,_std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>_>
                  *)in_stack_ffffffffffffff60,
                 (__normal_iterator<QWidgetLineControl::Command_*,_std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      __last = std::
               vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>::
               end((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                    *)in_stack_ffffffffffffff60);
      __gnu_cxx::
      __normal_iterator<QWidgetLineControl::Command_const*,std::vector<QWidgetLineControl::Command,std::allocator<QWidgetLineControl::Command>>>
      ::__normal_iterator<QWidgetLineControl::Command*>
                ((__normal_iterator<const_QWidgetLineControl::Command_*,_std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>_>
                  *)in_stack_ffffffffffffff60,
                 (__normal_iterator<QWidgetLineControl::Command_*,_std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      in_stack_ffffffffffffff70 =
           std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>::
           erase((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                  *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffffb8,__last._M_current);
      if (in_RDI->m_undoState < in_RDI->m_modifiedState) {
        in_RDI->m_modifiedState = -1;
      }
      *(ushort *)&in_RDI->field_0x50 = *(ushort *)&in_RDI->field_0x50 & 0xfeff | 0x100;
      *(ushort *)&in_RDI->field_0x50 = *(ushort *)&in_RDI->field_0x50 & 0xffbf;
    }
    updateDisplayText((QWidgetLineControl *)
                      CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      (bool)forceUpdate);
    if ((*(ushort *)&in_RDI->field_0x50 >> 6 & 1) != 0) {
      *(ushort *)&in_RDI->field_0x50 = *(ushort *)&in_RDI->field_0x50 & 0xffbf;
      text((QWidgetLineControl *)in_stack_ffffffffffffff70._M_current);
      if ((bVar1 & 1) != 0) {
        textEdited(in_stack_ffffffffffffff60,
                   (QString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      }
      textChanged(in_stack_ffffffffffffff60,
                  (QString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x5db962);
    }
  }
  if ((*(ushort *)&in_RDI->field_0x50 >> 7 & 1) != 0) {
    *(ushort *)&in_RDI->field_0x50 = *(ushort *)&in_RDI->field_0x50 & 0xff7f;
    selectionChanged((QWidgetLineControl *)0x5db997);
  }
  if (in_RDI->m_cursor == in_RDI->m_lastCursorPos) {
    updateMicroFocus((QWidgetLineControl *)0x5db9ae);
  }
  emitCursorPositionChanged(in_RDI);
  in_stack_ffffffffffffff97 = 1;
LAB_005db9bd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_ffffffffffffff97 & 1);
}

Assistant:

bool QWidgetLineControl::finishChange(int validateFromState, bool update, bool edited)
{
    Q_UNUSED(update);

    if (m_textDirty) {
        // do validation
        bool wasValidInput = m_validInput;
        m_validInput = true;
#ifndef QT_NO_VALIDATOR
        if (m_validator) {
            QString textCopy = m_text;
            int cursorCopy = m_cursor;
            m_validInput = (m_validator->validate(textCopy, cursorCopy) != QValidator::Invalid);
            if (m_validInput) {
                if (m_text != textCopy) {
                    internalSetText(textCopy, cursorCopy, edited);
                    return true;
                }
                m_cursor = cursorCopy;
            } else {
                emit inputRejected();
            }
        }
#endif
        if (validateFromState >= 0 && wasValidInput && !m_validInput) {
            if (m_transactions.size())
                return false;
            internalUndo(validateFromState);
            m_history.erase(m_history.begin() + m_undoState, m_history.end());
            if (m_modifiedState > m_undoState)
                m_modifiedState = -1;
            m_validInput = true;
            m_textDirty = false;
        }
        updateDisplayText();

        if (m_textDirty) {
            m_textDirty = false;
            QString actualText = text();
            if (edited)
                emit textEdited(actualText);
            emit textChanged(actualText);
        }
    }
    if (m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    if (m_cursor == m_lastCursorPos)
        emit updateMicroFocus();
    emitCursorPositionChanged();
    return true;
}